

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int fits_select_image_section(fitsfile **fptr,char *outfile,char *expr,int *status)

{
  int iVar1;
  int iVar2;
  fitsfile *outfptr;
  int hdunum;
  fitsfile *newptr;
  int local_34;
  fitsfile *local_30;
  
  iVar1 = ffinit(&local_30,outfile,status);
  if (0 < iVar1) {
    ffpmsg("failed to create output file for image section:");
    ffpmsg(outfile);
    goto LAB_0010f0e9;
  }
  ffghdn(*fptr,&local_34);
  outfptr = local_30;
  if ((*fptr)->Fptr->only_one == 0) {
    if (1 < local_34) {
      iVar1 = 1;
      do {
        ffmahd(*fptr,iVar1,(int *)0x0,status);
        iVar2 = ffcopy(*fptr,outfptr,0,status);
        if (0 < iVar2) goto LAB_0010f0e1;
        iVar1 = iVar1 + 1;
      } while (iVar1 < local_34);
    }
    ffmahd(*fptr,local_34,(int *)0x0,status);
  }
  iVar2 = fits_copy_image_section(*fptr,local_30,expr,status);
  iVar1 = local_34;
  outfptr = local_30;
  if (iVar2 < 1) {
    if ((*fptr)->Fptr->only_one == 0) {
      iVar2 = ffmahd(*fptr,local_34 + 1,(int *)0x0,status);
      while (iVar2 < 1) {
        ffcopy(*fptr,local_30,0,status);
        iVar2 = ffmahd(*fptr,iVar1 + 2,(int *)0x0,status);
        iVar1 = iVar1 + 1;
      }
      if (*status == 0x6b) {
        *status = 0;
      }
      else if (0 < *status) goto LAB_0010f0e1;
    }
    ffclos(*fptr,status);
    *fptr = local_30;
    if (iVar1 != local_34) {
      ffmahd(local_30,local_34,(int *)0x0,status);
      goto LAB_0010f0e9;
    }
    iVar1 = ffrdef(local_30,status);
    if (iVar1 < 1) goto LAB_0010f0e9;
    outfptr = *fptr;
  }
LAB_0010f0e1:
  ffclos(outfptr,status);
LAB_0010f0e9:
  return *status;
}

Assistant:

int fits_select_image_section(
           fitsfile **fptr,  /* IO - pointer to input image; on output it  */
                             /*      points to the new subimage */
           char *outfile,    /* I - name for output file        */
           char *expr,       /* I - Image section expression    */
           int *status)
{
  /*
     copies an image section from the input file to a new output file.
     Any HDUs preceding or following the image are also copied to the
     output file.
  */

    fitsfile *newptr;
    int ii, hdunum;

    /* create new empty file to hold the image section */
    if (ffinit(&newptr, outfile, status) > 0)
    {
        ffpmsg(
         "failed to create output file for image section:");
        ffpmsg(outfile);
        return(*status);
    }

    fits_get_hdu_num(*fptr, &hdunum);  /* current HDU number in input file */

    /* copy all preceding extensions to the output file, if 'only_one' flag not set */
    if (!(((*fptr)->Fptr)->only_one)) {
      for (ii = 1; ii < hdunum; ii++)
      {
        fits_movabs_hdu(*fptr, ii, NULL, status);
        if (fits_copy_hdu(*fptr, newptr, 0, status) > 0)
        {
            ffclos(newptr, status);
            return(*status);
        }
      }

      /* move back to the original HDU position */
      fits_movabs_hdu(*fptr, hdunum, NULL, status);
    }

    if (fits_copy_image_section(*fptr, newptr, expr, status) > 0)
    {
        ffclos(newptr, status);
        return(*status);
    }

    /* copy any remaining HDUs to the output file, if 'only_one' flag not set */

    if (!(((*fptr)->Fptr)->only_one)) {
      for (ii = hdunum + 1; 1; ii++)
      {
        if (fits_movabs_hdu(*fptr, ii, NULL, status) > 0)
            break;

        fits_copy_hdu(*fptr, newptr, 0, status);
      }

      if (*status == END_OF_FILE)   
        *status = 0;              /* got the expected EOF error; reset = 0  */
      else if (*status > 0)
      {
        ffclos(newptr, status);
        return(*status);
      }
    } else {
      ii = hdunum + 1;  /* this value of ii is required below */
    }

    /* close the original file and return ptr to the new image */
    ffclos(*fptr, status);

    *fptr = newptr; /* reset the pointer to the new table */

    /* move back to the image subsection */
    if (ii - 1 != hdunum)
        fits_movabs_hdu(*fptr, hdunum, NULL, status);
    else
    {
        /* may have to reset BSCALE and BZERO pixel scaling, */
        /* since the keywords were previously turned off */

        if (ffrdef(*fptr, status) > 0)  
        {
            ffclos(*fptr, status);
            return(*status);
        }

    }

    return(*status);
}